

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool passed;
  bool in_stack_00000283;
  int in_stack_00000284;
  int in_stack_00000288;
  int in_stack_0000028c;
  int in_stack_00000290;
  int in_stack_00000294;
  bool local_17;
  bool local_16;
  bool local_15;
  bool local_14;
  bool local_13;
  
  bVar1 = test_conv_2d_dw(in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                          in_stack_00000284,in_stack_00000283);
  bVar2 = test_conv_2d_dw(in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                          in_stack_00000284,in_stack_00000283);
  local_13 = false;
  if (!bVar2) {
    bVar1 = local_13;
  }
  local_13 = bVar1;
  bVar2 = test_conv_2d_dw(in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                          in_stack_00000284,in_stack_00000283);
  local_14 = false;
  bVar1 = local_13;
  if (!bVar2) {
    bVar1 = local_14;
  }
  local_14 = bVar1;
  bVar2 = test_conv_2d_dw(in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                          in_stack_00000284,in_stack_00000283);
  local_15 = false;
  bVar1 = local_14;
  if (!bVar2) {
    bVar1 = local_15;
  }
  local_15 = bVar1;
  bVar2 = test_conv_2d_dw(in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                          in_stack_00000284,in_stack_00000283);
  local_16 = false;
  bVar1 = local_15;
  if (!bVar2) {
    bVar1 = local_16;
  }
  local_16 = bVar1;
  bVar2 = test_conv_2d_dw(in_stack_00000294,in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                          in_stack_00000284,in_stack_00000283);
  local_17 = false;
  bVar1 = local_16;
  if (!bVar2) {
    bVar1 = local_17;
  }
  local_17 = bVar1;
  return (uint)(local_17 == false);
}

Assistant:

int main(int argc, char ** argv) {
    bool passed = true;
    passed = test_conv_2d_dw(3, 1, 1, 0, 1, false) && passed;
    passed = test_conv_2d_dw(3, 1, 1, 0, 1, true) && passed;
    passed = test_conv_2d_dw(42, 3, 2, 1, 1, false) && passed;
    passed = test_conv_2d_dw(42, 3, 2, 1, 1, true) && passed;
    passed = test_conv_2d_dw(8, 5, 1, 2, 2, false) && passed;
    passed = test_conv_2d_dw(8, 5, 1, 2, 2, true) && passed;
    return passed ? 0 : 1;
}